

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O0

void addquoted(lua_State *L,luaL_Buffer *b,int arg)

{
  char cVar1;
  char *pcVar2;
  char *local_30;
  char *s;
  size_t l;
  luaL_Buffer *plStack_18;
  int arg_local;
  luaL_Buffer *b_local;
  lua_State *L_local;
  
  l._4_4_ = arg;
  plStack_18 = b;
  b_local = (luaL_Buffer *)L;
  local_30 = luaL_checklstring(L,arg,(size_t *)&s);
  if (plStack_18 + 1 <= (luaL_Buffer *)plStack_18->p) {
    luaL_prepbuffer(plStack_18);
  }
  pcVar2 = plStack_18->p;
  plStack_18->p = pcVar2 + 1;
  *pcVar2 = '\"';
  do {
    pcVar2 = s + -1;
    if (s == (char *)0x0) {
      if (plStack_18 + 1 <= (luaL_Buffer *)plStack_18->p) {
        s = pcVar2;
        luaL_prepbuffer(plStack_18);
      }
      pcVar2 = plStack_18->p;
      plStack_18->p = pcVar2 + 1;
      *pcVar2 = '\"';
      return;
    }
    cVar1 = *local_30;
    if (cVar1 == '\0') {
      s = pcVar2;
      luaL_addlstring(plStack_18,"\\000",4);
    }
    else if (cVar1 == '\n') {
LAB_0011cde3:
      s = pcVar2;
      if (plStack_18 + 1 <= (luaL_Buffer *)plStack_18->p) {
        luaL_prepbuffer(plStack_18);
      }
      pcVar2 = plStack_18->p;
      plStack_18->p = pcVar2 + 1;
      *pcVar2 = '\\';
      if (plStack_18 + 1 <= (luaL_Buffer *)plStack_18->p) {
        luaL_prepbuffer(plStack_18);
      }
      cVar1 = *local_30;
      pcVar2 = plStack_18->p;
      plStack_18->p = pcVar2 + 1;
      *pcVar2 = cVar1;
    }
    else if (cVar1 == '\r') {
      s = pcVar2;
      luaL_addlstring(plStack_18,"\\r",2);
    }
    else {
      if ((cVar1 == '\"') || (cVar1 == '\\')) goto LAB_0011cde3;
      s = pcVar2;
      if (plStack_18 + 1 <= (luaL_Buffer *)plStack_18->p) {
        luaL_prepbuffer(plStack_18);
      }
      cVar1 = *local_30;
      pcVar2 = plStack_18->p;
      plStack_18->p = pcVar2 + 1;
      *pcVar2 = cVar1;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static void addquoted (lua_State *L, luaL_Buffer *b, int arg) {
  size_t l;
  const char *s = luaL_checklstring(L, arg, &l);
  luaL_addchar(b, '"');
  while (l--) {
    switch (*s) {
      case '"': case '\\': case '\n': {
        luaL_addchar(b, '\\');
        luaL_addchar(b, *s);
        break;
      }
      case '\r': {
        luaL_addlstring(b, "\\r", 2);
        break;
      }
      case '\0': {
        luaL_addlstring(b, "\\000", 4);
        break;
      }
      default: {
        luaL_addchar(b, *s);
        break;
      }
    }
    s++;
  }
  luaL_addchar(b, '"');
}